

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O3

SQChar * __thiscall SQLexer::Tok2Str(SQLexer *this,SQInteger tok)

{
  SQUnsignedInteger *pSVar1;
  SQObjectValue SVar2;
  _HashNode **pp_Var3;
  SQObjectPtr itr;
  SQObjectPtr val;
  SQObjectPtr key;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  local_60.super_SQObject._type = OT_NULL;
  local_60.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_40.super_SQObject._type = OT_NULL;
  local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_50.super_SQObject._type = OT_NULL;
  local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
  do {
    SVar2.nInteger = SQTable::Next(this->_keywords,false,&local_60,&local_40,&local_50);
    if (SVar2.pTable == (SQTable *)0xffffffffffffffff) {
      pp_Var3 = (_HashNode **)0x0;
      goto LAB_0011fa0f;
    }
    if ((local_60.super_SQObject._type & 0x8000000) != 0) {
      pSVar1 = &((local_60.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*((local_60.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    local_60.super_SQObject._type = OT_INTEGER;
    local_60.super_SQObject._unVal.nInteger = SVar2.nInteger;
  } while (local_50.super_SQObject._unVal.pTable != (SQTable *)tok);
  pp_Var3 = &(local_40.super_SQObject._unVal.pTable)->_firstfree;
LAB_0011fa0f:
  SQObjectPtr::~SQObjectPtr(&local_50);
  SQObjectPtr::~SQObjectPtr(&local_40);
  SQObjectPtr::~SQObjectPtr(&local_60);
  return (SQChar *)pp_Var3;
}

Assistant:

const SQChar *SQLexer::Tok2Str(SQInteger tok)
{
    SQObjectPtr itr, key, val;
    SQInteger nitr;
    while((nitr = _keywords->Next(false,itr, key, val)) != -1) {
        itr = (SQInteger)nitr;
        if(((SQInteger)_integer(val)) == tok)
            return _stringval(key);
    }
    return NULL;
}